

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64_test.cc
# Opt level: O3

void __thiscall
prometheus::anon_unknown_0::Base64Test_rejectInvalidPadding_Test::TestBody
          (Base64Test_rejectInvalidPadding_Test *this)

{
  bool bVar1;
  AssertHelper AStack_58;
  string local_50;
  string local_30;
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"A===","");
      detail::base64_decode(&local_30,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p != &local_30.field_2) {
        operator_delete(local_30._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
  }
  testing::Message::Message((Message *)&local_50);
  testing::internal::AssertHelper::AssertHelper
            (&AStack_58,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/util/tests/unit/base64_test.cc"
             ,0x4a,
             "Expected: detail::base64_decode(\"A===\") throws an exception.\n  Actual: it doesn\'t."
            );
  testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_50);
  testing::internal::AssertHelper::~AssertHelper(&AStack_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    (**(code **)(*(size_type *)local_50._M_dataplus._M_p + 8))();
  }
  return;
}

Assistant:

TEST(Base64Test, rejectInvalidPadding) {
  EXPECT_ANY_THROW(detail::base64_decode("A==="));
}